

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

size_t __thiscall caffe::EltwiseParameter::ByteSizeLong(EltwiseParameter *this)

{
  uint uVar1;
  void *pvVar2;
  int iVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) == 0) {
    sVar4 = 0;
  }
  else {
    sVar4 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize
                      ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  sVar4 = sVar4 + (ulong)(uint)(this->coeff_).current_size_ * 5;
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      if (this->operation_ < 0) {
        uVar6 = 0xb;
      }
      else {
        uVar5 = this->operation_ | 1;
        iVar3 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        uVar6 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 1);
      }
      sVar4 = sVar4 + uVar6;
    }
    sVar4 = sVar4 + (uVar1 & 2);
  }
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

size_t EltwiseParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.EltwiseParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated float coeff = 2;
  {
    unsigned int count = this->coeff_size();
    size_t data_size = 4UL * count;
    total_size += 1 *
                  ::google::protobuf::internal::FromIntSize(this->coeff_size());
    total_size += data_size;
  }

  if (_has_bits_[0 / 32] & 3u) {
    // optional .caffe.EltwiseParameter.EltwiseOp operation = 1 [default = SUM];
    if (has_operation()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->operation());
    }

    // optional bool stable_prod_grad = 3 [default = true];
    if (has_stable_prod_grad()) {
      total_size += 1 + 1;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}